

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O2

void kca_ffd(kca_joint *joint,ma_abi *m,ma_wrench *f)

{
  frame *pfVar1;
  frame *pfVar2;
  uint __line;
  char *__assertion;
  
  if (joint == (kca_joint *)0x0) {
    __assertion = "joint";
    __line = 0x5a;
  }
  else if (m == (ma_abi *)0x0) {
    __assertion = "m";
    __line = 0x5b;
  }
  else if (f == (ma_wrench *)0x0) {
    __assertion = "f";
    __line = 0x5c;
  }
  else {
    pfVar1 = m->frame;
    if (pfVar1 == (frame *)0x0) {
      __assertion = "m->frame";
      __line = 0x5d;
    }
    else if (m->point == pfVar1->origin) {
      if (joint->target_body == m->body) {
        pfVar2 = joint->target_frame;
        if (pfVar2 == pfVar1) {
          f->body = joint->reference_body;
          f->frame = pfVar2;
          f->point = pfVar2->origin;
          return;
        }
        __assertion = "joint->target_frame == m->frame";
        __line = 0x60;
      }
      else {
        __assertion = "joint->target_body == m->body";
        __line = 0x5f;
      }
    }
    else {
      __assertion = "m->point == m->frame->origin";
      __line = 0x5e;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,__line,
                "void kca_ffd(const struct kca_joint *, const struct ma_abi *, struct ma_wrench *)")
  ;
}

Assistant:

void kca_ffd(
        const struct kca_joint *joint,
        const struct ma_abi *m,
        struct ma_wrench *f)
{
    assert(joint);
    assert(m);
    assert(f);
    assert(m->frame);
    assert(m->point == m->frame->origin);
    assert(joint->target_body == m->body);
    assert(joint->target_frame == m->frame);

    f->body = joint->reference_body;
    f->frame = joint->target_frame;
    f->point = joint->target_frame->origin;
}